

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

ElementsDecodeRawTransactionTxIn * __thiscall
cfd::js::api::json::ElementsDecodeRawTransactionTxIn::GetTxidString_abi_cxx11_
          (ElementsDecodeRawTransactionTxIn *this,ElementsDecodeRawTransactionTxIn *obj)

{
  ElementsDecodeRawTransactionTxIn *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->txid_);
  return this;
}

Assistant:

static std::string GetTxidString(  // line separate
      const ElementsDecodeRawTransactionTxIn& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.txid_);
  }